

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t refill_buffer(hFILE *fp)

{
  int *piVar1;
  long local_20;
  ssize_t n;
  hFILE *fp_local;
  
  if (fp->buffer < fp->begin) {
    fp->offset = (off_t)(fp->begin + (fp->offset - (long)fp->buffer));
    memmove(fp->buffer,fp->begin,(long)fp->end - (long)fp->begin);
    fp->end = fp->end + ((long)fp->buffer - (long)fp->begin);
    fp->begin = fp->buffer;
  }
  if (((char)(fp->field_0x30 << 7) < '\0') || (fp->end == fp->limit)) {
    local_20 = 0;
  }
  else {
    local_20 = (*fp->backend->read)(fp,fp->end,(long)fp->limit - (long)fp->end);
    if (local_20 < 0) {
      piVar1 = __errno_location();
      fp->has_errno = *piVar1;
      return local_20;
    }
    if (local_20 == 0) {
      fp->field_0x30 = fp->field_0x30 & 0xfe | 1;
    }
  }
  fp->end = fp->end + local_20;
  return local_20;
}

Assistant:

static ssize_t refill_buffer(hFILE *fp)
{
    ssize_t n;

    // Move any unread characters to the start of the buffer
    if (fp->begin > fp->buffer) {
        fp->offset += fp->begin - fp->buffer;
        memmove(fp->buffer, fp->begin, fp->end - fp->begin);
        fp->end = &fp->buffer[fp->end - fp->begin];
        fp->begin = fp->buffer;
    }

    // Read into the available buffer space at fp->[end,limit)
    if (fp->at_eof || fp->end == fp->limit) n = 0;
    else {
        n = fp->backend->read(fp, fp->end, fp->limit - fp->end);
        if (n < 0) { fp->has_errno = errno; return n; }
        else if (n == 0) fp->at_eof = 1;
    }

    fp->end += n;
    return n;
}